

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb<ncnn::BinaryOp_x86_avx_functor::binary_op_atan2>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  int in_ECX;
  undefined8 *in_RDX;
  uint *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  float fVar79;
  float fVar80;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  __m128 _outp_2;
  __m128 _b_2;
  __m128 _p_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m128 _b1;
  __m128 _b0;
  __m256 _p_1;
  int i_1;
  __m256 _outp;
  __m256 _b;
  __m256 _p;
  int i;
  binary_op_atan2 op;
  __m256 special_result;
  __m256 negative_mask_full_x;
  __m256 normal_result;
  __m256 pi_additions;
  __m256 negative_mask_y;
  __m256 negative_mask_x;
  __m256 normal_mode;
  __m256 not_equal_zero_y;
  __m256 not_equal_zero_x;
  __m256 magic_half_pi;
  __m256 magic_pi;
  __m256 magic_negative_zero;
  __m256 magic_zero;
  __m256 special_result_1;
  __m256 negative_mask_full_x_1;
  __m256 normal_result_1;
  __m256 pi_additions_1;
  __m256 negative_mask_y_1;
  __m256 negative_mask_x_1;
  __m256 normal_mode_1;
  __m256 not_equal_zero_y_1;
  __m256 not_equal_zero_x_1;
  __m256 magic_half_pi_2;
  __m256 magic_pi_1;
  __m256 magic_negative_zero_2;
  __m256 magic_zero_1;
  __m256 output_approx_1;
  __m256 fourth_power_of_input_approx_1;
  __m256 square_of_input_approx_1;
  __m256 input_approx_1;
  __m256 is_small_input_1;
  __m256 absolute_1;
  __m256 negative_mask_1;
  __m256 magic_a8_1;
  __m256 magic_a7_1;
  __m256 magic_a6_1;
  __m256 magic_a5_1;
  __m256 magic_a4_1;
  __m256 magic_a3_1;
  __m256 magic_a2_1;
  __m256 magic_a1_1;
  __m256 magic_a0_1;
  __m256 magic_half_pi_3;
  __m256 magic_negative_one_1;
  __m256 magic_one_1;
  __m256 magic_negative_zero_3;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_a8;
  __m256 magic_a7;
  __m256 magic_a6;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_half_pi_1;
  __m256 magic_negative_one;
  __m256 magic_one;
  __m256 magic_negative_zero_1;
  __m128 special_result_2;
  __m128 negative_mask_full_x_2;
  __m128 normal_result_2;
  __m128 pi_additions_2;
  __m128 negative_mask_y_2;
  __m128 negative_mask_x_2;
  __m128 normal_mode_2;
  __m128 not_equal_zero_y_2;
  __m128 not_equal_zero_x_2;
  __m128 magic_half_pi_4;
  __m128 magic_pi_2;
  __m128 magic_negative_zero_4;
  __m128 magic_zero_2;
  __m128 output_approx_2;
  __m128 fourth_power_of_input_approx_2;
  __m128 square_of_input_approx_2;
  __m128 input_approx_2;
  __m128 is_small_input_2;
  __m128 absolute_2;
  __m128 negative_mask_2;
  __m128 magic_a8_2;
  __m128 magic_a7_2;
  __m128 magic_a6_2;
  __m128 magic_a5_2;
  __m128 magic_a4_2;
  __m128 magic_a3_2;
  __m128 magic_a2_2;
  __m128 magic_a1_2;
  __m128 magic_a0_2;
  __m128 magic_half_pi_5;
  __m128 magic_negative_one_2;
  __m128 magic_one_2;
  __m128 magic_negative_zero_5;
  undefined8 local_3f50;
  undefined8 uStack_3f48;
  undefined8 local_3f20;
  undefined8 uStack_3f18;
  undefined8 uStack_3f10;
  undefined8 uStack_3f08;
  int local_3e84;
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  int local_3e18;
  undefined8 *local_3e08;
  uint *local_3e00;
  undefined1 (*local_3df8) [32];
  undefined8 uStack_3cb0;
  undefined8 uStack_3ca8;
  float local_3a40;
  float fStack_3a3c;
  float fStack_3a38;
  float fStack_3a34;
  float fStack_3a30;
  float fStack_3a2c;
  float fStack_3a28;
  float fStack_3a24;
  float local_3a20;
  float fStack_3a1c;
  float fStack_3a18;
  float fStack_3a14;
  float fStack_3a10;
  float fStack_3a0c;
  float fStack_3a08;
  float fStack_3a04;
  undefined8 uStack_39d0;
  undefined8 uStack_39c8;
  undefined8 uStack_3990;
  undefined8 uStack_3988;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  float local_3340;
  float fStack_333c;
  float fStack_3338;
  float fStack_3334;
  float fStack_3330;
  float fStack_332c;
  float fStack_3328;
  float fStack_3324;
  float local_3320;
  float fStack_331c;
  float fStack_3318;
  float fStack_3314;
  float fStack_3310;
  float fStack_330c;
  float fStack_3308;
  float fStack_3304;
  undefined8 uStack_32d0;
  undefined8 uStack_32c8;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  undefined8 uStack_3210;
  undefined8 uStack_3208;
  float local_2aa0;
  float fStack_2a9c;
  float fStack_2a98;
  float fStack_2a94;
  float fStack_2a90;
  float fStack_2a8c;
  float fStack_2a88;
  float fStack_2a84;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  float local_2640;
  float fStack_263c;
  float fStack_2638;
  float fStack_2634;
  float fStack_2630;
  float fStack_262c;
  float fStack_2628;
  float fStack_2624;
  float local_2520;
  float fStack_251c;
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float local_23e0;
  float fStack_23dc;
  float fStack_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  float local_2340;
  float fStack_233c;
  float fStack_2338;
  float fStack_2334;
  float fStack_2330;
  float fStack_232c;
  float fStack_2328;
  float local_2300;
  float fStack_22fc;
  float fStack_22f8;
  float fStack_22f4;
  float fStack_22f0;
  float fStack_22ec;
  float fStack_22e8;
  float local_22a0;
  float fStack_229c;
  float fStack_2298;
  float fStack_2294;
  float fStack_2290;
  float fStack_228c;
  float fStack_2288;
  float local_2200;
  float fStack_21fc;
  float fStack_21f8;
  float fStack_21f4;
  float fStack_21f0;
  float fStack_21ec;
  float fStack_21e8;
  float local_2160;
  float fStack_215c;
  float fStack_2158;
  float fStack_2154;
  float fStack_2150;
  float fStack_214c;
  float fStack_2148;
  float local_2120;
  float fStack_211c;
  float fStack_2118;
  float fStack_2114;
  float fStack_2110;
  float fStack_210c;
  float fStack_2108;
  float local_1ba0;
  float fStack_1b9c;
  float fStack_1b98;
  float fStack_1b94;
  float fStack_1b90;
  float fStack_1b8c;
  float fStack_1b88;
  float fStack_1b84;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  float local_1740;
  float fStack_173c;
  float fStack_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float fStack_1728;
  float fStack_1724;
  float local_1620;
  float fStack_161c;
  float fStack_1618;
  float fStack_1614;
  float fStack_1610;
  float fStack_160c;
  float fStack_1608;
  float local_1580;
  float fStack_157c;
  float fStack_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  float fStack_1568;
  float local_14e0;
  float fStack_14dc;
  float fStack_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float local_1440;
  float fStack_143c;
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float local_1300;
  float fStack_12fc;
  float fStack_12f8;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  float fStack_12e8;
  float local_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float local_1220;
  float fStack_121c;
  float fStack_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  uint local_e80;
  uint uStack_e7c;
  uint uStack_e78;
  uint uStack_e74;
  uint uStack_e70;
  uint uStack_e6c;
  uint uStack_e68;
  uint uStack_e64;
  uint local_dc0;
  uint uStack_dbc;
  uint uStack_db8;
  uint uStack_db4;
  uint uStack_db0;
  uint uStack_dac;
  uint uStack_da8;
  uint uStack_da4;
  float local_c30;
  float fStack_c2c;
  float fStack_c28;
  float fStack_c24;
  float local_c20;
  float fStack_c1c;
  float fStack_c18;
  float fStack_c14;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float local_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  
  local_3e08 = in_RDX;
  local_3e00 = in_RSI;
  local_3df8 = in_RDI;
  if (in_R8D == 8) {
    for (local_3e18 = 0; local_3e18 < in_ECX; local_3e18 = local_3e18 + 1) {
      uVar1 = *local_3e00;
      auVar13 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar1),0x20);
      auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar1),0x30);
      auVar14 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(uVar1),0x20);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(uVar1),0x30);
      uStack_3cb0 = auVar14._0_8_;
      uStack_3ca8 = auVar14._8_8_;
      auVar78._16_8_ = uStack_3cb0;
      auVar78._0_16_ = auVar13;
      auVar78._24_8_ = uStack_3ca8;
      auVar77._16_8_ = uStack_3cb0;
      auVar77._0_16_ = auVar13;
      auVar77._24_8_ = uStack_3ca8;
      auVar76._16_8_ = uStack_3cb0;
      auVar76._0_16_ = auVar13;
      auVar76._24_8_ = uStack_3ca8;
      auVar7._16_8_ = uStack_3cb0;
      auVar7._0_16_ = auVar13;
      auVar7._24_8_ = uStack_3ca8;
      auVar13 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar13 = vinsertps_avx(auVar13,ZEXT416(0),0x20);
      auVar13 = vinsertps_avx(auVar13,ZEXT416(0),0x30);
      auVar14 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0),0x20);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0),0x30);
      uStack_39d0 = auVar14._0_8_;
      uStack_39c8 = auVar14._8_8_;
      auVar14 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0x80000000),0x20);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0x80000000),0x30);
      auVar15 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar15 = vinsertps_avx(auVar15,ZEXT416(0x80000000),0x20);
      auVar15 = vinsertps_avx(auVar15,ZEXT416(0x80000000),0x30);
      uStack_3990 = auVar15._0_8_;
      uStack_3988 = auVar15._8_8_;
      auVar15 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar15 = vinsertps_avx(auVar15,ZEXT416(0x40490fdb),0x20);
      auVar15 = vinsertps_avx(auVar15,ZEXT416(0x40490fdb),0x30);
      auVar16 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x40490fdb),0x20);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x40490fdb),0x30);
      uStack_3950 = auVar16._0_8_;
      uStack_3948 = auVar16._8_8_;
      auVar16 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3fc90fdb),0x20);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3fc90fdb),0x30);
      auVar17 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3fc90fdb),0x20);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3fc90fdb),0x30);
      uStack_3910 = auVar17._0_8_;
      uStack_3908 = auVar17._8_8_;
      auVar6._16_8_ = uStack_39d0;
      auVar6._0_16_ = auVar13;
      auVar6._24_8_ = uStack_39c8;
      auVar6 = vcmpps_avx(auVar7,auVar6,4);
      auVar2._16_8_ = uStack_39d0;
      auVar2._0_16_ = auVar13;
      auVar2._24_8_ = uStack_39c8;
      auVar7 = vcmpps_avx(*local_3df8,auVar2,4);
      auVar6 = vandps_avx(auVar6,auVar7);
      auVar10._16_8_ = uStack_3990;
      auVar10._0_16_ = auVar14;
      auVar10._24_8_ = uStack_3988;
      auVar2 = vandps_avx(auVar10,auVar76);
      auVar5._16_8_ = uStack_3990;
      auVar5._0_16_ = auVar14;
      auVar5._24_8_ = uStack_3988;
      auVar3 = vandps_avx(auVar5,*local_3df8);
      auVar9._16_8_ = uStack_39d0;
      auVar9._0_16_ = auVar13;
      auVar9._24_8_ = uStack_39c8;
      auVar8 = vcmpps_avx(auVar77,auVar9,1);
      auVar9 = vcmpps_avx(*local_3df8,auVar9,1);
      auVar4._16_8_ = uStack_3990;
      auVar4._0_16_ = auVar14;
      auVar4._24_8_ = uStack_3988;
      auVar9 = vandps_avx(auVar9,auVar4);
      auVar43._16_8_ = uStack_3950;
      auVar43._0_16_ = auVar15;
      auVar43._24_8_ = uStack_3948;
      auVar9 = vorps_avx(auVar9,auVar43);
      auVar9 = vandps_avx(auVar8,auVar9);
      auVar12 = vdivps_avx(*local_3df8,auVar78);
      auVar14 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0x80000000),0x20);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0x80000000),0x30);
      auVar17 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x80000000),0x20);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x80000000),0x30);
      uStack_1b10 = auVar17._0_8_;
      uStack_1b08 = auVar17._8_8_;
      auVar17 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x20);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x30);
      auVar18 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x30);
      uStack_1ad0 = auVar18._0_8_;
      uStack_1ac8 = auVar18._8_8_;
      auVar18 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0xbf800000),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0xbf800000),0x30);
      auVar19 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0xbf800000),0x20);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0xbf800000),0x30);
      uStack_1a90 = auVar19._0_8_;
      uStack_1a88 = auVar19._8_8_;
      auVar19 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3fc90fdb),0x20);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3fc90fdb),0x30);
      auVar20 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3fc90fdb),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3fc90fdb),0x30);
      uStack_1a50 = auVar20._0_8_;
      uStack_1a48 = auVar20._8_8_;
      auVar20 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3f800000),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3f800000),0x30);
      auVar21 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3f800000),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3f800000),0x30);
      auVar22 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0xbeaaaa53),0x20);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0xbeaaaa53),0x30);
      auVar23 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbeaaaa53),0x20);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbeaaaa53),0x30);
      auVar24 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3e4cb974),0x20);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3e4cb974),0x30);
      auVar25 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3e4cb974),0x20);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3e4cb974),0x30);
      auVar26 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0xbe117200),0x20);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0xbe117200),0x30);
      auVar27 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0xbe117200),0x20);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0xbe117200),0x30);
      auVar28 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0x3dd9ed24),0x20);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0x3dd9ed24),0x30);
      auVar29 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3dd9ed24),0x20);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3dd9ed24),0x30);
      auVar30 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar30 = vinsertps_avx(auVar30,ZEXT416(0xbd99b01e),0x20);
      auVar30 = vinsertps_avx(auVar30,ZEXT416(0xbd99b01e),0x30);
      auVar31 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar31 = vinsertps_avx(auVar31,ZEXT416(0xbd99b01e),0x20);
      auVar31 = vinsertps_avx(auVar31,ZEXT416(0xbd99b01e),0x30);
      auVar32 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar32 = vinsertps_avx(auVar32,ZEXT416(0x3d2edd4e),0x20);
      auVar32 = vinsertps_avx(auVar32,ZEXT416(0x3d2edd4e),0x30);
      auVar33 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar33 = vinsertps_avx(auVar33,ZEXT416(0x3d2edd4e),0x20);
      auVar33 = vinsertps_avx(auVar33,ZEXT416(0x3d2edd4e),0x30);
      auVar34 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar34 = vinsertps_avx(auVar34,ZEXT416(0xbc83a25c),0x20);
      auVar34 = vinsertps_avx(auVar34,ZEXT416(0xbc83a25c),0x30);
      auVar35 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar35 = vinsertps_avx(auVar35,ZEXT416(0xbc83a25c),0x20);
      auVar35 = vinsertps_avx(auVar35,ZEXT416(0xbc83a25c),0x30);
      auVar36 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar36 = vinsertps_avx(auVar36,ZEXT416(0x3b3ac537),0x20);
      auVar36 = vinsertps_avx(auVar36,ZEXT416(0x3b3ac537),0x30);
      auVar37 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar37 = vinsertps_avx(auVar37,ZEXT416(0x3b3ac537),0x20);
      auVar37 = vinsertps_avx(auVar37,ZEXT416(0x3b3ac537),0x30);
      auVar64._16_8_ = uStack_1b10;
      auVar64._0_16_ = auVar14;
      auVar64._24_8_ = uStack_1b08;
      auVar8 = vandps_avx(auVar64,auVar12);
      auVar67._16_8_ = uStack_1b10;
      auVar67._0_16_ = auVar14;
      auVar67._24_8_ = uStack_1b08;
      auVar10 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar4 = vandnps_avx(auVar67,auVar12);
      auVar61._16_8_ = uStack_1ad0;
      auVar61._0_16_ = auVar17;
      auVar61._24_8_ = uStack_1ac8;
      auVar11 = vcmpps_avx(auVar61,auVar4,1);
      auVar63._16_8_ = uStack_1a90;
      auVar63._0_16_ = auVar18;
      auVar63._24_8_ = uStack_1a88;
      auVar12 = vandps_avx(auVar11,auVar63);
      auVar5 = vandnps_avx(auVar11,auVar4);
      auVar5 = vorps_avx(auVar12,auVar5);
      auVar12 = vandps_avx(auVar11,auVar4);
      auVar66._16_8_ = uStack_1ad0;
      auVar66._0_16_ = auVar17;
      auVar66._24_8_ = uStack_1ac8;
      auVar4 = vandnps_avx(auVar11,auVar66);
      auVar12 = vorps_avx(auVar12,auVar4);
      auVar12 = vdivps_avx(auVar5,auVar12);
      local_1740 = auVar12._0_4_;
      fStack_173c = auVar12._4_4_;
      fStack_1738 = auVar12._8_4_;
      fStack_1734 = auVar12._12_4_;
      fStack_1730 = auVar12._16_4_;
      fStack_172c = auVar12._20_4_;
      fStack_1728 = auVar12._24_4_;
      fStack_1724 = auVar12._28_4_;
      fVar79 = local_1740 * local_1740;
      fVar83 = fStack_173c * fStack_173c;
      fVar85 = fStack_1738 * fStack_1738;
      fVar87 = fStack_1734 * fStack_1734;
      fVar89 = fStack_1730 * fStack_1730;
      fVar91 = fStack_172c * fStack_172c;
      fVar93 = fStack_1728 * fStack_1728;
      fVar80 = fVar79 * fVar79;
      fVar84 = fVar83 * fVar83;
      fVar86 = fVar85 * fVar85;
      fVar88 = fVar87 * fVar87;
      fVar90 = fVar89 * fVar89;
      fVar92 = fVar91 * fVar91;
      fVar94 = fVar93 * fVar93;
      local_1220 = auVar34._0_4_;
      fStack_121c = auVar34._4_4_;
      fStack_1218 = auVar34._8_4_;
      fStack_1214 = auVar34._12_4_;
      fStack_1210 = auVar35._0_4_;
      fStack_120c = auVar35._4_4_;
      fStack_1208 = auVar35._8_4_;
      local_1260 = auVar30._0_4_;
      fStack_125c = auVar30._4_4_;
      fStack_1258 = auVar30._8_4_;
      fStack_1254 = auVar30._12_4_;
      fStack_1250 = auVar31._0_4_;
      fStack_124c = auVar31._4_4_;
      fStack_1248 = auVar31._8_4_;
      local_1300 = auVar26._0_4_;
      fStack_12fc = auVar26._4_4_;
      fStack_12f8 = auVar26._8_4_;
      fStack_12f4 = auVar26._12_4_;
      fStack_12f0 = auVar27._0_4_;
      fStack_12ec = auVar27._4_4_;
      fStack_12e8 = auVar27._8_4_;
      local_13a0 = auVar22._0_4_;
      fStack_139c = auVar22._4_4_;
      fStack_1398 = auVar22._8_4_;
      fStack_1394 = auVar22._12_4_;
      fStack_1390 = auVar23._0_4_;
      fStack_138c = auVar23._4_4_;
      fStack_1388 = auVar23._8_4_;
      local_1400 = auVar36._0_4_;
      fStack_13fc = auVar36._4_4_;
      fStack_13f8 = auVar36._8_4_;
      fStack_13f4 = auVar36._12_4_;
      fStack_13f0 = auVar37._0_4_;
      fStack_13ec = auVar37._4_4_;
      fStack_13e8 = auVar37._8_4_;
      local_1440 = auVar32._0_4_;
      fStack_143c = auVar32._4_4_;
      fStack_1438 = auVar32._8_4_;
      fStack_1434 = auVar32._12_4_;
      fStack_1430 = auVar33._0_4_;
      fStack_142c = auVar33._4_4_;
      fStack_1428 = auVar33._8_4_;
      local_14e0 = auVar28._0_4_;
      fStack_14dc = auVar28._4_4_;
      fStack_14d8 = auVar28._8_4_;
      fStack_14d4 = auVar28._12_4_;
      fStack_14d0 = auVar29._0_4_;
      fStack_14cc = auVar29._4_4_;
      fStack_14c8 = auVar29._8_4_;
      local_1580 = auVar24._0_4_;
      fStack_157c = auVar24._4_4_;
      fStack_1578 = auVar24._8_4_;
      fStack_1574 = auVar24._12_4_;
      fStack_1570 = auVar25._0_4_;
      fStack_156c = auVar25._4_4_;
      fStack_1568 = auVar25._8_4_;
      local_1620 = auVar20._0_4_;
      fStack_161c = auVar20._4_4_;
      fStack_1618 = auVar20._8_4_;
      fStack_1614 = auVar20._12_4_;
      fStack_1610 = auVar21._0_4_;
      fStack_160c = auVar21._4_4_;
      fStack_1608 = auVar21._8_4_;
      auVar62._16_8_ = uStack_1a50;
      auVar62._0_16_ = auVar19;
      auVar62._24_8_ = uStack_1a48;
      auVar12 = vandps_avx(auVar11,auVar62);
      local_1ba0 = auVar12._0_4_;
      fStack_1b9c = auVar12._4_4_;
      fStack_1b98 = auVar12._8_4_;
      fStack_1b94 = auVar12._12_4_;
      fStack_1b90 = auVar12._16_4_;
      fStack_1b8c = auVar12._20_4_;
      fStack_1b88 = auVar12._24_4_;
      fStack_1b84 = auVar12._28_4_;
      auVar65._4_4_ =
           (fVar83 * (fVar84 * (fVar84 * (fVar84 * fStack_121c + fStack_125c) + fStack_12fc) +
                     fStack_139c) +
           fVar84 * (fVar84 * (fVar84 * (fVar84 * fStack_13fc + fStack_143c) + fStack_14dc) +
                    fStack_157c) + fStack_161c) * fStack_173c + fStack_1b9c;
      auVar65._0_4_ =
           (fVar79 * (fVar80 * (fVar80 * (fVar80 * local_1220 + local_1260) + local_1300) +
                     local_13a0) +
           fVar80 * (fVar80 * (fVar80 * (fVar80 * local_1400 + local_1440) + local_14e0) +
                    local_1580) + local_1620) * local_1740 + local_1ba0;
      auVar65._8_4_ =
           (fVar85 * (fVar86 * (fVar86 * (fVar86 * fStack_1218 + fStack_1258) + fStack_12f8) +
                     fStack_1398) +
           fVar86 * (fVar86 * (fVar86 * (fVar86 * fStack_13f8 + fStack_1438) + fStack_14d8) +
                    fStack_1578) + fStack_1618) * fStack_1738 + fStack_1b98;
      auVar65._12_4_ =
           (fVar87 * (fVar88 * (fVar88 * (fVar88 * fStack_1214 + fStack_1254) + fStack_12f4) +
                     fStack_1394) +
           fVar88 * (fVar88 * (fVar88 * (fVar88 * fStack_13f4 + fStack_1434) + fStack_14d4) +
                    fStack_1574) + fStack_1614) * fStack_1734 + fStack_1b94;
      auVar65._16_4_ =
           (fVar89 * (fVar90 * (fVar90 * (fVar90 * fStack_1210 + fStack_1250) + fStack_12f0) +
                     fStack_1390) +
           fVar90 * (fVar90 * (fVar90 * (fVar90 * fStack_13f0 + fStack_1430) + fStack_14d0) +
                    fStack_1570) + fStack_1610) * fStack_1730 + fStack_1b90;
      auVar65._20_4_ =
           (fVar91 * (fVar92 * (fVar92 * (fVar92 * fStack_120c + fStack_124c) + fStack_12ec) +
                     fStack_138c) +
           fVar92 * (fVar92 * (fVar92 * (fVar92 * fStack_13ec + fStack_142c) + fStack_14cc) +
                    fStack_156c) + fStack_160c) * fStack_172c + fStack_1b8c;
      auVar65._24_4_ =
           (fVar93 * (fVar94 * (fVar94 * (fVar94 * fStack_1208 + fStack_1248) + fStack_12e8) +
                     fStack_1388) +
           fVar94 * (fVar94 * (fVar94 * (fVar94 * fStack_13e8 + fStack_1428) + fStack_14c8) +
                    fStack_1568) + fStack_1608) * fStack_1728 + fStack_1b88;
      auVar65._28_4_ = fStack_1724 + fStack_1b84;
      auVar8 = vorps_avx(auVar65,auVar8);
      local_3a20 = auVar8._0_4_;
      fStack_3a1c = auVar8._4_4_;
      fStack_3a18 = auVar8._8_4_;
      fStack_3a14 = auVar8._12_4_;
      fStack_3a10 = auVar8._16_4_;
      fStack_3a0c = auVar8._20_4_;
      fStack_3a08 = auVar8._24_4_;
      fStack_3a04 = auVar8._28_4_;
      local_3a40 = auVar9._0_4_;
      fStack_3a3c = auVar9._4_4_;
      fStack_3a38 = auVar9._8_4_;
      fStack_3a34 = auVar9._12_4_;
      fStack_3a30 = auVar9._16_4_;
      fStack_3a2c = auVar9._20_4_;
      fStack_3a28 = auVar9._24_4_;
      fStack_3a24 = auVar9._28_4_;
      auVar42._16_8_ = uStack_3950;
      auVar42._0_16_ = auVar15;
      auVar42._24_8_ = uStack_3948;
      auVar2 = vorps_avx(auVar2,auVar42);
      auVar8._16_8_ = uStack_39d0;
      auVar8._0_16_ = auVar13;
      auVar8._24_8_ = uStack_39c8;
      auVar9 = vcmpps_avx(auVar2,auVar8,1);
      auVar11._16_8_ = uStack_3910;
      auVar11._0_16_ = auVar16;
      auVar11._24_8_ = uStack_3908;
      auVar2 = vorps_avx(auVar3,auVar11);
      auVar2 = vandps_avx(auVar7,auVar2);
      auVar3._16_8_ = uStack_3950;
      auVar3._0_16_ = auVar15;
      auVar3._24_8_ = uStack_3948;
      auVar3 = vandps_avx(auVar9,auVar3);
      auVar71._16_8_ = uStack_39d0;
      auVar71._0_16_ = auVar13;
      auVar71._24_8_ = uStack_39c8;
      auVar9 = vandnps_avx(auVar9,auVar71);
      auVar3 = vorps_avx(auVar3,auVar9);
      auVar3 = vandnps_avx(auVar7,auVar3);
      auVar3 = vorps_avx(auVar2,auVar3);
      auVar12._4_4_ = fStack_3a1c + fStack_3a3c;
      auVar12._0_4_ = local_3a20 + local_3a40;
      auVar12._12_4_ = fStack_3a14 + fStack_3a34;
      auVar12._8_4_ = fStack_3a18 + fStack_3a38;
      auVar12._20_4_ = fStack_3a0c + fStack_3a2c;
      auVar12._16_4_ = fStack_3a10 + fStack_3a30;
      auVar12._28_4_ = fStack_3a04 + fStack_3a24;
      auVar12._24_4_ = fStack_3a08 + fStack_3a28;
      auVar2 = vandps_avx(auVar6,auVar12);
      local_dc0 = auVar6._0_4_;
      uStack_dbc = auVar6._4_4_;
      uStack_db8 = auVar6._8_4_;
      uStack_db4 = auVar6._12_4_;
      uStack_db0 = auVar6._16_4_;
      uStack_dac = auVar6._20_4_;
      uStack_da8 = auVar6._24_4_;
      uStack_da4 = auVar6._28_4_;
      auVar81._0_4_ = local_dc0 ^ auVar10._0_4_;
      auVar81._4_4_ = uStack_dbc ^ auVar10._4_4_;
      auVar81._8_4_ = uStack_db8 ^ auVar10._8_4_;
      auVar81._12_4_ = uStack_db4 ^ auVar10._12_4_;
      auVar81._16_4_ = uStack_db0 ^ auVar10._16_4_;
      auVar81._20_4_ = uStack_dac ^ auVar10._20_4_;
      auVar81._24_4_ = uStack_da8 ^ auVar10._24_4_;
      auVar81._28_4_ = uStack_da4 ^ auVar10._28_4_;
      auVar6 = vandps_avx(auVar81,auVar3);
      auVar6 = vorps_avx(auVar2,auVar6);
      local_3e80 = auVar6._0_8_;
      uStack_3e78 = auVar6._8_8_;
      uStack_3e70 = auVar6._16_8_;
      uStack_3e68 = auVar6._24_8_;
      *local_3e08 = local_3e80;
      local_3e08[1] = uStack_3e78;
      local_3e08[2] = uStack_3e70;
      local_3e08[3] = uStack_3e68;
      local_3df8 = local_3df8 + 1;
      local_3e00 = local_3e00 + 1;
      local_3e08 = local_3e08 + 4;
    }
  }
  if (in_R8D == 4) {
    for (local_3e84 = 0; local_3e84 + 1 < in_ECX; local_3e84 = local_3e84 + 2) {
      uVar1 = *local_3e00;
      uVar40 = CONCAT44(uVar1,uVar1);
      uVar41 = CONCAT44(uVar1,uVar1);
      uVar1 = local_3e00[1];
      uVar38 = CONCAT44(uVar1,uVar1);
      uVar39 = CONCAT44(uVar1,uVar1);
      auVar75._8_8_ = uVar41;
      auVar75._0_8_ = uVar40;
      auVar75._16_8_ = uVar38;
      auVar75._24_8_ = uVar39;
      auVar74._8_8_ = uVar41;
      auVar74._0_8_ = uVar40;
      auVar74._16_8_ = uVar38;
      auVar74._24_8_ = uVar39;
      auVar73._8_8_ = uVar41;
      auVar73._0_8_ = uVar40;
      auVar73._16_8_ = uVar38;
      auVar73._24_8_ = uVar39;
      auVar72._8_8_ = uVar41;
      auVar72._0_8_ = uVar40;
      auVar72._16_8_ = uVar38;
      auVar72._24_8_ = uVar39;
      auVar13 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar13 = vinsertps_avx(auVar13,ZEXT416(0),0x20);
      auVar13 = vinsertps_avx(auVar13,ZEXT416(0),0x30);
      auVar14 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0),0x20);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0),0x30);
      uStack_32d0 = auVar14._0_8_;
      uStack_32c8 = auVar14._8_8_;
      auVar14 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0x80000000),0x20);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0x80000000),0x30);
      auVar15 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar15 = vinsertps_avx(auVar15,ZEXT416(0x80000000),0x20);
      auVar15 = vinsertps_avx(auVar15,ZEXT416(0x80000000),0x30);
      uStack_3290 = auVar15._0_8_;
      uStack_3288 = auVar15._8_8_;
      auVar15 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar15 = vinsertps_avx(auVar15,ZEXT416(0x40490fdb),0x20);
      auVar15 = vinsertps_avx(auVar15,ZEXT416(0x40490fdb),0x30);
      auVar16 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x40490fdb),0x20);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x40490fdb),0x30);
      uStack_3250 = auVar16._0_8_;
      uStack_3248 = auVar16._8_8_;
      auVar16 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3fc90fdb),0x20);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3fc90fdb),0x30);
      auVar17 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3fc90fdb),0x20);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3fc90fdb),0x30);
      uStack_3210 = auVar17._0_8_;
      uStack_3208 = auVar17._8_8_;
      auVar44._16_8_ = uStack_32d0;
      auVar44._0_16_ = auVar13;
      auVar44._24_8_ = uStack_32c8;
      auVar6 = vcmpps_avx(auVar72,auVar44,4);
      auVar45._16_8_ = uStack_32d0;
      auVar45._0_16_ = auVar13;
      auVar45._24_8_ = uStack_32c8;
      auVar7 = vcmpps_avx(*local_3df8,auVar45,4);
      auVar6 = vandps_avx(auVar6,auVar7);
      auVar52._16_8_ = uStack_3290;
      auVar52._0_16_ = auVar14;
      auVar52._24_8_ = uStack_3288;
      auVar2 = vandps_avx(auVar52,auVar73);
      auVar51._16_8_ = uStack_3290;
      auVar51._0_16_ = auVar14;
      auVar51._24_8_ = uStack_3288;
      auVar3 = vandps_avx(auVar51,*local_3df8);
      auVar46._16_8_ = uStack_32d0;
      auVar46._0_16_ = auVar13;
      auVar46._24_8_ = uStack_32c8;
      auVar8 = vcmpps_avx(auVar74,auVar46,1);
      auVar9 = vcmpps_avx(*local_3df8,auVar46,1);
      auVar50._16_8_ = uStack_3290;
      auVar50._0_16_ = auVar14;
      auVar50._24_8_ = uStack_3288;
      auVar9 = vandps_avx(auVar9,auVar50);
      auVar55._16_8_ = uStack_3250;
      auVar55._0_16_ = auVar15;
      auVar55._24_8_ = uStack_3248;
      auVar9 = vorps_avx(auVar9,auVar55);
      auVar9 = vandps_avx(auVar8,auVar9);
      auVar12 = vdivps_avx(*local_3df8,auVar75);
      auVar14 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0x80000000),0x20);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0x80000000),0x30);
      auVar17 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x80000000),0x20);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x80000000),0x30);
      uStack_2a10 = auVar17._0_8_;
      uStack_2a08 = auVar17._8_8_;
      auVar17 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x20);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x30);
      auVar18 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x30);
      uStack_29d0 = auVar18._0_8_;
      uStack_29c8 = auVar18._8_8_;
      auVar18 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0xbf800000),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0xbf800000),0x30);
      auVar19 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0xbf800000),0x20);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0xbf800000),0x30);
      uStack_2990 = auVar19._0_8_;
      uStack_2988 = auVar19._8_8_;
      auVar19 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3fc90fdb),0x20);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3fc90fdb),0x30);
      auVar20 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3fc90fdb),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3fc90fdb),0x30);
      uStack_2950 = auVar20._0_8_;
      uStack_2948 = auVar20._8_8_;
      auVar20 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3f800000),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3f800000),0x30);
      auVar21 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3f800000),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3f800000),0x30);
      auVar22 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0xbeaaaa53),0x20);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0xbeaaaa53),0x30);
      auVar23 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbeaaaa53),0x20);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbeaaaa53),0x30);
      auVar24 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3e4cb974),0x20);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3e4cb974),0x30);
      auVar25 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3e4cb974),0x20);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3e4cb974),0x30);
      auVar26 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0xbe117200),0x20);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0xbe117200),0x30);
      auVar27 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0xbe117200),0x20);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0xbe117200),0x30);
      auVar28 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0x3dd9ed24),0x20);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0x3dd9ed24),0x30);
      auVar29 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3dd9ed24),0x20);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3dd9ed24),0x30);
      auVar30 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar30 = vinsertps_avx(auVar30,ZEXT416(0xbd99b01e),0x20);
      auVar30 = vinsertps_avx(auVar30,ZEXT416(0xbd99b01e),0x30);
      auVar31 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar31 = vinsertps_avx(auVar31,ZEXT416(0xbd99b01e),0x20);
      auVar31 = vinsertps_avx(auVar31,ZEXT416(0xbd99b01e),0x30);
      auVar32 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar32 = vinsertps_avx(auVar32,ZEXT416(0x3d2edd4e),0x20);
      auVar32 = vinsertps_avx(auVar32,ZEXT416(0x3d2edd4e),0x30);
      auVar33 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar33 = vinsertps_avx(auVar33,ZEXT416(0x3d2edd4e),0x20);
      auVar33 = vinsertps_avx(auVar33,ZEXT416(0x3d2edd4e),0x30);
      auVar34 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar34 = vinsertps_avx(auVar34,ZEXT416(0xbc83a25c),0x20);
      auVar34 = vinsertps_avx(auVar34,ZEXT416(0xbc83a25c),0x30);
      auVar35 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar35 = vinsertps_avx(auVar35,ZEXT416(0xbc83a25c),0x20);
      auVar35 = vinsertps_avx(auVar35,ZEXT416(0xbc83a25c),0x30);
      auVar36 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar36 = vinsertps_avx(auVar36,ZEXT416(0x3b3ac537),0x20);
      auVar36 = vinsertps_avx(auVar36,ZEXT416(0x3b3ac537),0x30);
      auVar37 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar37 = vinsertps_avx(auVar37,ZEXT416(0x3b3ac537),0x20);
      auVar37 = vinsertps_avx(auVar37,ZEXT416(0x3b3ac537),0x30);
      auVar59._16_8_ = uStack_2a10;
      auVar59._0_16_ = auVar14;
      auVar59._24_8_ = uStack_2a08;
      auVar8 = vandps_avx(auVar59,auVar12);
      auVar69._16_8_ = uStack_2a10;
      auVar69._0_16_ = auVar14;
      auVar69._24_8_ = uStack_2a08;
      auVar10 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar4 = vandnps_avx(auVar69,auVar12);
      auVar56._16_8_ = uStack_29d0;
      auVar56._0_16_ = auVar17;
      auVar56._24_8_ = uStack_29c8;
      auVar11 = vcmpps_avx(auVar56,auVar4,1);
      auVar58._16_8_ = uStack_2990;
      auVar58._0_16_ = auVar18;
      auVar58._24_8_ = uStack_2988;
      auVar12 = vandps_avx(auVar11,auVar58);
      auVar5 = vandnps_avx(auVar11,auVar4);
      auVar5 = vorps_avx(auVar12,auVar5);
      auVar12 = vandps_avx(auVar11,auVar4);
      auVar68._16_8_ = uStack_29d0;
      auVar68._0_16_ = auVar17;
      auVar68._24_8_ = uStack_29c8;
      auVar4 = vandnps_avx(auVar11,auVar68);
      auVar12 = vorps_avx(auVar12,auVar4);
      auVar12 = vdivps_avx(auVar5,auVar12);
      local_2640 = auVar12._0_4_;
      fStack_263c = auVar12._4_4_;
      fStack_2638 = auVar12._8_4_;
      fStack_2634 = auVar12._12_4_;
      fStack_2630 = auVar12._16_4_;
      fStack_262c = auVar12._20_4_;
      fStack_2628 = auVar12._24_4_;
      fStack_2624 = auVar12._28_4_;
      fVar79 = local_2640 * local_2640;
      fVar83 = fStack_263c * fStack_263c;
      fVar85 = fStack_2638 * fStack_2638;
      fVar87 = fStack_2634 * fStack_2634;
      fVar89 = fStack_2630 * fStack_2630;
      fVar91 = fStack_262c * fStack_262c;
      fVar93 = fStack_2628 * fStack_2628;
      fVar80 = fVar79 * fVar79;
      fVar84 = fVar83 * fVar83;
      fVar86 = fVar85 * fVar85;
      fVar88 = fVar87 * fVar87;
      fVar90 = fVar89 * fVar89;
      fVar92 = fVar91 * fVar91;
      fVar94 = fVar93 * fVar93;
      local_2120 = auVar34._0_4_;
      fStack_211c = auVar34._4_4_;
      fStack_2118 = auVar34._8_4_;
      fStack_2114 = auVar34._12_4_;
      fStack_2110 = auVar35._0_4_;
      fStack_210c = auVar35._4_4_;
      fStack_2108 = auVar35._8_4_;
      local_2160 = auVar30._0_4_;
      fStack_215c = auVar30._4_4_;
      fStack_2158 = auVar30._8_4_;
      fStack_2154 = auVar30._12_4_;
      fStack_2150 = auVar31._0_4_;
      fStack_214c = auVar31._4_4_;
      fStack_2148 = auVar31._8_4_;
      local_2200 = auVar26._0_4_;
      fStack_21fc = auVar26._4_4_;
      fStack_21f8 = auVar26._8_4_;
      fStack_21f4 = auVar26._12_4_;
      fStack_21f0 = auVar27._0_4_;
      fStack_21ec = auVar27._4_4_;
      fStack_21e8 = auVar27._8_4_;
      local_22a0 = auVar22._0_4_;
      fStack_229c = auVar22._4_4_;
      fStack_2298 = auVar22._8_4_;
      fStack_2294 = auVar22._12_4_;
      fStack_2290 = auVar23._0_4_;
      fStack_228c = auVar23._4_4_;
      fStack_2288 = auVar23._8_4_;
      local_2300 = auVar36._0_4_;
      fStack_22fc = auVar36._4_4_;
      fStack_22f8 = auVar36._8_4_;
      fStack_22f4 = auVar36._12_4_;
      fStack_22f0 = auVar37._0_4_;
      fStack_22ec = auVar37._4_4_;
      fStack_22e8 = auVar37._8_4_;
      local_2340 = auVar32._0_4_;
      fStack_233c = auVar32._4_4_;
      fStack_2338 = auVar32._8_4_;
      fStack_2334 = auVar32._12_4_;
      fStack_2330 = auVar33._0_4_;
      fStack_232c = auVar33._4_4_;
      fStack_2328 = auVar33._8_4_;
      local_23e0 = auVar28._0_4_;
      fStack_23dc = auVar28._4_4_;
      fStack_23d8 = auVar28._8_4_;
      fStack_23d4 = auVar28._12_4_;
      fStack_23d0 = auVar29._0_4_;
      fStack_23cc = auVar29._4_4_;
      fStack_23c8 = auVar29._8_4_;
      local_2480 = auVar24._0_4_;
      fStack_247c = auVar24._4_4_;
      fStack_2478 = auVar24._8_4_;
      fStack_2474 = auVar24._12_4_;
      fStack_2470 = auVar25._0_4_;
      fStack_246c = auVar25._4_4_;
      fStack_2468 = auVar25._8_4_;
      local_2520 = auVar20._0_4_;
      fStack_251c = auVar20._4_4_;
      fStack_2518 = auVar20._8_4_;
      fStack_2514 = auVar20._12_4_;
      fStack_2510 = auVar21._0_4_;
      fStack_250c = auVar21._4_4_;
      fStack_2508 = auVar21._8_4_;
      auVar57._16_8_ = uStack_2950;
      auVar57._0_16_ = auVar19;
      auVar57._24_8_ = uStack_2948;
      auVar12 = vandps_avx(auVar11,auVar57);
      local_2aa0 = auVar12._0_4_;
      fStack_2a9c = auVar12._4_4_;
      fStack_2a98 = auVar12._8_4_;
      fStack_2a94 = auVar12._12_4_;
      fStack_2a90 = auVar12._16_4_;
      fStack_2a8c = auVar12._20_4_;
      fStack_2a88 = auVar12._24_4_;
      fStack_2a84 = auVar12._28_4_;
      auVar60._4_4_ =
           (fVar83 * (fVar84 * (fVar84 * (fVar84 * fStack_211c + fStack_215c) + fStack_21fc) +
                     fStack_229c) +
           fVar84 * (fVar84 * (fVar84 * (fVar84 * fStack_22fc + fStack_233c) + fStack_23dc) +
                    fStack_247c) + fStack_251c) * fStack_263c + fStack_2a9c;
      auVar60._0_4_ =
           (fVar79 * (fVar80 * (fVar80 * (fVar80 * local_2120 + local_2160) + local_2200) +
                     local_22a0) +
           fVar80 * (fVar80 * (fVar80 * (fVar80 * local_2300 + local_2340) + local_23e0) +
                    local_2480) + local_2520) * local_2640 + local_2aa0;
      auVar60._8_4_ =
           (fVar85 * (fVar86 * (fVar86 * (fVar86 * fStack_2118 + fStack_2158) + fStack_21f8) +
                     fStack_2298) +
           fVar86 * (fVar86 * (fVar86 * (fVar86 * fStack_22f8 + fStack_2338) + fStack_23d8) +
                    fStack_2478) + fStack_2518) * fStack_2638 + fStack_2a98;
      auVar60._12_4_ =
           (fVar87 * (fVar88 * (fVar88 * (fVar88 * fStack_2114 + fStack_2154) + fStack_21f4) +
                     fStack_2294) +
           fVar88 * (fVar88 * (fVar88 * (fVar88 * fStack_22f4 + fStack_2334) + fStack_23d4) +
                    fStack_2474) + fStack_2514) * fStack_2634 + fStack_2a94;
      auVar60._16_4_ =
           (fVar89 * (fVar90 * (fVar90 * (fVar90 * fStack_2110 + fStack_2150) + fStack_21f0) +
                     fStack_2290) +
           fVar90 * (fVar90 * (fVar90 * (fVar90 * fStack_22f0 + fStack_2330) + fStack_23d0) +
                    fStack_2470) + fStack_2510) * fStack_2630 + fStack_2a90;
      auVar60._20_4_ =
           (fVar91 * (fVar92 * (fVar92 * (fVar92 * fStack_210c + fStack_214c) + fStack_21ec) +
                     fStack_228c) +
           fVar92 * (fVar92 * (fVar92 * (fVar92 * fStack_22ec + fStack_232c) + fStack_23cc) +
                    fStack_246c) + fStack_250c) * fStack_262c + fStack_2a8c;
      auVar60._24_4_ =
           (fVar93 * (fVar94 * (fVar94 * (fVar94 * fStack_2108 + fStack_2148) + fStack_21e8) +
                     fStack_2288) +
           fVar94 * (fVar94 * (fVar94 * (fVar94 * fStack_22e8 + fStack_2328) + fStack_23c8) +
                    fStack_2468) + fStack_2508) * fStack_2628 + fStack_2a88;
      auVar60._28_4_ = fStack_2624 + fStack_2a84;
      auVar8 = vorps_avx(auVar60,auVar8);
      local_3320 = auVar8._0_4_;
      fStack_331c = auVar8._4_4_;
      fStack_3318 = auVar8._8_4_;
      fStack_3314 = auVar8._12_4_;
      fStack_3310 = auVar8._16_4_;
      fStack_330c = auVar8._20_4_;
      fStack_3308 = auVar8._24_4_;
      fStack_3304 = auVar8._28_4_;
      local_3340 = auVar9._0_4_;
      fStack_333c = auVar9._4_4_;
      fStack_3338 = auVar9._8_4_;
      fStack_3334 = auVar9._12_4_;
      fStack_3330 = auVar9._16_4_;
      fStack_332c = auVar9._20_4_;
      fStack_3328 = auVar9._24_4_;
      fStack_3324 = auVar9._28_4_;
      auVar54._16_8_ = uStack_3250;
      auVar54._0_16_ = auVar15;
      auVar54._24_8_ = uStack_3248;
      auVar2 = vorps_avx(auVar2,auVar54);
      auVar47._16_8_ = uStack_32d0;
      auVar47._0_16_ = auVar13;
      auVar47._24_8_ = uStack_32c8;
      auVar9 = vcmpps_avx(auVar2,auVar47,1);
      auVar53._16_8_ = uStack_3210;
      auVar53._0_16_ = auVar16;
      auVar53._24_8_ = uStack_3208;
      auVar2 = vorps_avx(auVar3,auVar53);
      auVar2 = vandps_avx(auVar7,auVar2);
      auVar49._16_8_ = uStack_3250;
      auVar49._0_16_ = auVar15;
      auVar49._24_8_ = uStack_3248;
      auVar3 = vandps_avx(auVar9,auVar49);
      auVar70._16_8_ = uStack_32d0;
      auVar70._0_16_ = auVar13;
      auVar70._24_8_ = uStack_32c8;
      auVar9 = vandnps_avx(auVar9,auVar70);
      auVar3 = vorps_avx(auVar3,auVar9);
      auVar3 = vandnps_avx(auVar7,auVar3);
      auVar3 = vorps_avx(auVar2,auVar3);
      auVar48._4_4_ = fStack_331c + fStack_333c;
      auVar48._0_4_ = local_3320 + local_3340;
      auVar48._12_4_ = fStack_3314 + fStack_3334;
      auVar48._8_4_ = fStack_3318 + fStack_3338;
      auVar48._20_4_ = fStack_330c + fStack_332c;
      auVar48._16_4_ = fStack_3310 + fStack_3330;
      auVar48._28_4_ = fStack_3304 + fStack_3324;
      auVar48._24_4_ = fStack_3308 + fStack_3328;
      auVar2 = vandps_avx(auVar6,auVar48);
      local_e80 = auVar6._0_4_;
      uStack_e7c = auVar6._4_4_;
      uStack_e78 = auVar6._8_4_;
      uStack_e74 = auVar6._12_4_;
      uStack_e70 = auVar6._16_4_;
      uStack_e6c = auVar6._20_4_;
      uStack_e68 = auVar6._24_4_;
      uStack_e64 = auVar6._28_4_;
      auVar82._0_4_ = local_e80 ^ auVar10._0_4_;
      auVar82._4_4_ = uStack_e7c ^ auVar10._4_4_;
      auVar82._8_4_ = uStack_e78 ^ auVar10._8_4_;
      auVar82._12_4_ = uStack_e74 ^ auVar10._12_4_;
      auVar82._16_4_ = uStack_e70 ^ auVar10._16_4_;
      auVar82._20_4_ = uStack_e6c ^ auVar10._20_4_;
      auVar82._24_4_ = uStack_e68 ^ auVar10._24_4_;
      auVar82._28_4_ = uStack_e64 ^ auVar10._28_4_;
      auVar6 = vandps_avx(auVar82,auVar3);
      auVar6 = vorps_avx(auVar2,auVar6);
      local_3f20 = auVar6._0_8_;
      uStack_3f18 = auVar6._8_8_;
      uStack_3f10 = auVar6._16_8_;
      uStack_3f08 = auVar6._24_8_;
      *local_3e08 = local_3f20;
      local_3e08[1] = uStack_3f18;
      local_3e08[2] = uStack_3f10;
      local_3e08[3] = uStack_3f08;
      local_3df8 = local_3df8 + 1;
      local_3e00 = local_3e00 + 2;
      local_3e08 = local_3e08 + 4;
    }
    for (; local_3e84 < in_ECX; local_3e84 = local_3e84 + 1) {
      uVar1 = *local_3e00;
      uVar38 = CONCAT44(uVar1,uVar1);
      uVar39 = CONCAT44(uVar1,uVar1);
      auVar32._8_8_ = uVar39;
      auVar32._0_8_ = uVar38;
      auVar31._8_8_ = uVar39;
      auVar31._0_8_ = uVar38;
      auVar30._8_8_ = uVar39;
      auVar30._0_8_ = uVar38;
      auVar14._8_8_ = uVar39;
      auVar14._0_8_ = uVar38;
      auVar13 = vcmpps_avx(auVar14,ZEXT816(0),4);
      auVar14 = vcmpps_avx(*(undefined1 (*) [16])*local_3df8,ZEXT816(0),4);
      auVar16 = vpand_avx(auVar13,auVar14);
      auVar18._8_8_ = 0x8000000080000000;
      auVar18._0_8_ = 0x8000000080000000;
      auVar17 = vpand_avx(auVar18,auVar30);
      auVar15._8_8_ = 0x8000000080000000;
      auVar15._0_8_ = 0x8000000080000000;
      auVar18 = vpand_avx(auVar15,*(undefined1 (*) [16])*local_3df8);
      auVar13 = vcmpps_avx(auVar31,ZEXT816(0),1);
      auVar15 = vcmpps_avx(*(undefined1 (*) [16])*local_3df8,ZEXT816(0),1);
      auVar19._8_8_ = 0x8000000080000000;
      auVar19._0_8_ = 0x8000000080000000;
      auVar15 = vpand_avx(auVar15,auVar19);
      auVar22._8_8_ = 0x40490fdb40490fdb;
      auVar22._0_8_ = 0x40490fdb40490fdb;
      auVar15 = vpor_avx(auVar15,auVar22);
      auVar19 = vpand_avx(auVar13,auVar15);
      auVar13 = vdivps_avx(*(undefined1 (*) [16])*local_3df8,auVar32);
      auVar23._8_8_ = 0x8000000080000000;
      auVar23._0_8_ = 0x8000000080000000;
      auVar20 = vpand_avx(auVar23,auVar13);
      auVar29._8_8_ = 0x8000000080000000;
      auVar29._0_8_ = 0x8000000080000000;
      auVar23 = vpcmpeqd_avx(auVar22,auVar22);
      auVar21 = vpandn_avx(auVar29,auVar13);
      auVar27._8_8_ = 0x3f8000003f800000;
      auVar27._0_8_ = 0x3f8000003f800000;
      auVar13 = vcmpps_avx(auVar27,auVar21,1);
      auVar25._8_8_ = 0xbf800000bf800000;
      auVar25._0_8_ = 0xbf800000bf800000;
      auVar15 = vpand_avx(auVar13,auVar25);
      auVar22 = vpandn_avx(auVar13,auVar21);
      auVar22 = vpor_avx(auVar15,auVar22);
      auVar15 = vpand_avx(auVar13,auVar21);
      auVar28._8_8_ = 0x3f8000003f800000;
      auVar28._0_8_ = 0x3f8000003f800000;
      auVar21 = vpandn_avx(auVar13,auVar28);
      auVar15 = vpor_avx(auVar15,auVar21);
      auVar15 = vdivps_avx(auVar22,auVar15);
      local_6d0 = auVar15._0_4_;
      fStack_6cc = auVar15._4_4_;
      fStack_6c8 = auVar15._8_4_;
      fStack_6c4 = auVar15._12_4_;
      fVar79 = local_6d0 * local_6d0;
      fVar83 = fStack_6cc * fStack_6cc;
      fVar85 = fStack_6c8 * fStack_6c8;
      fVar87 = fStack_6c4 * fStack_6c4;
      fVar80 = fVar79 * fVar79;
      fVar84 = fVar83 * fVar83;
      fVar86 = fVar85 * fVar85;
      fVar88 = fVar87 * fVar87;
      auVar24._8_8_ = 0x3fc90fdb3fc90fdb;
      auVar24._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar13 = vpand_avx(auVar13,auVar24);
      local_740 = auVar13._0_4_;
      fStack_73c = auVar13._4_4_;
      fStack_738 = auVar13._8_4_;
      fStack_734 = auVar13._12_4_;
      auVar26._4_4_ =
           (fVar83 * (fVar84 * (fVar84 * (fVar84 * -0.01606863 + -0.07504295) + -0.14203644) +
                     -0.33333072) +
           fVar84 * (fVar84 * (fVar84 * (fVar84 * 0.0028498897 + 0.04269152) + 0.10640934) +
                    0.1999262) + 1.0) * fStack_6cc + fStack_73c;
      auVar26._0_4_ =
           (fVar79 * (fVar80 * (fVar80 * (fVar80 * -0.01606863 + -0.07504295) + -0.14203644) +
                     -0.33333072) +
           fVar80 * (fVar80 * (fVar80 * (fVar80 * 0.0028498897 + 0.04269152) + 0.10640934) +
                    0.1999262) + 1.0) * local_6d0 + local_740;
      auVar26._8_4_ =
           (fVar85 * (fVar86 * (fVar86 * (fVar86 * -0.01606863 + -0.07504295) + -0.14203644) +
                     -0.33333072) +
           fVar86 * (fVar86 * (fVar86 * (fVar86 * 0.0028498897 + 0.04269152) + 0.10640934) +
                    0.1999262) + 1.0) * fStack_6c8 + fStack_738;
      auVar26._12_4_ =
           (fVar87 * (fVar88 * (fVar88 * (fVar88 * -0.01606863 + -0.07504295) + -0.14203644) +
                     -0.33333072) +
           fVar88 * (fVar88 * (fVar88 * (fVar88 * 0.0028498897 + 0.04269152) + 0.10640934) +
                    0.1999262) + 1.0) * fStack_6c4 + fStack_734;
      auVar13 = vpor_avx(auVar26,auVar20);
      local_c20 = auVar13._0_4_;
      fStack_c1c = auVar13._4_4_;
      fStack_c18 = auVar13._8_4_;
      fStack_c14 = auVar13._12_4_;
      local_c30 = auVar19._0_4_;
      fStack_c2c = auVar19._4_4_;
      fStack_c28 = auVar19._8_4_;
      fStack_c24 = auVar19._12_4_;
      auVar21._8_8_ = 0x40490fdb40490fdb;
      auVar21._0_8_ = 0x40490fdb40490fdb;
      auVar13 = vpor_avx(auVar17,auVar21);
      auVar13 = vcmpps_avx(auVar13,ZEXT816(0),1);
      auVar20._8_8_ = 0x3fc90fdb3fc90fdb;
      auVar20._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar15 = vpor_avx(auVar18,auVar20);
      auVar15 = vpand_avx(auVar14,auVar15);
      auVar17._8_8_ = 0x40490fdb40490fdb;
      auVar17._0_8_ = 0x40490fdb40490fdb;
      auVar17 = vpand_avx(auVar13,auVar17);
      auVar13 = vpandn_avx(auVar13,ZEXT816(0));
      auVar13 = vpor_avx(auVar17,auVar13);
      auVar13 = vpandn_avx(auVar14,auVar13);
      auVar14 = vpor_avx(auVar15,auVar13);
      auVar13._4_4_ = fStack_c1c + fStack_c2c;
      auVar13._0_4_ = local_c20 + local_c30;
      auVar13._12_4_ = fStack_c14 + fStack_c24;
      auVar13._8_4_ = fStack_c18 + fStack_c28;
      auVar13 = vpand_avx(auVar16,auVar13);
      auVar14 = vpand_avx(auVar16 ^ auVar23,auVar14);
      auVar13 = vpor_avx(auVar13,auVar14);
      local_3f50 = auVar13._0_8_;
      uStack_3f48 = auVar13._8_8_;
      *local_3e08 = local_3f50;
      local_3e08[1] = uStack_3f48;
      local_3df8 = (undefined1 (*) [32])(*local_3df8 + 0x10);
      local_3e00 = local_3e00 + 1;
      local_3e08 = local_3e08 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        for (; i < w; i++)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
#if __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
#if __AVX__
#if __AVX512F__
        for (; i + 3 < w; i += 4)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}